

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::MapObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *newObj,JavascriptArray *newArr,bool isBuiltinArrayCtor,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  Var pvVar6;
  JavascriptMethod p_Var7;
  uint64 uVar8;
  uint64 uVar9;
  Var aItem;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  BigIndex index;
  BigIndex idxDest;
  BigIndex local_b0;
  BigIndex local_a0;
  unsigned_long local_90;
  double local_88;
  double dStack_80;
  undefined4 *local_78;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,obj);
  if (start < length) {
    local_78 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_90 = length;
    do {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar4 = JavascriptOperators::HasItem((RecyclableObject *)jsReentLock._24_8_,start);
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
      *(bool *)((long)local_70 + 0x108) = true;
      if (BVar4 != 0) {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar6 = JavascriptOperators::GetItem
                           ((RecyclableObject *)jsReentLock._24_8_,start,scriptContext);
        this = scriptContext->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var7);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        if (start < 0x80000000) {
          uVar10 = start + 0x1000000000000;
        }
        else {
          auVar11._8_4_ = (int)(start >> 0x20);
          auVar11._0_8_ = start;
          auVar11._12_4_ = 0x45300000;
          dStack_80 = (double)CONCAT44(0x43300000,(int)start) - 4503599627370496.0;
          dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
          local_88 = dStack_80 + dVar12;
          dStack_80 = dStack_80 + dVar12;
          uVar8 = NumberUtilities::ToSpecial(local_88);
          bVar2 = NumberUtilities::IsNan(local_88);
          if (bVar2) {
            uVar9 = NumberUtilities::ToSpecial(local_88);
            if (uVar9 != 0xfff8000000000000) {
              uVar9 = NumberUtilities::ToSpecial(local_88);
              if (uVar9 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *local_78 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                *local_78 = 0;
              }
            }
          }
          uVar10 = uVar8 ^ 0xfffc000000000000;
        }
        aItem = (Var)0x0;
        pvVar6 = (*p_Var7)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,
                           pvVar6,uVar10,jsReentLock._24_8_);
        this->reentrancySafeOrHandled = bVar3;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        length = local_90;
        *(bool *)((long)local_70 + 0x108) = true;
        if (newArr == (JavascriptArray *)0x0 || !isBuiltinArrayCtor) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BigIndex::BigIndex(&local_b0,start);
          idxDest.bigIndex = (uint64)pvVar6;
          idxDest._0_8_ = local_b0.bigIndex;
          uVar5 = SetArrayLikeObjects((JavascriptArray *)newObj,
                                      (RecyclableObject *)(ulong)local_b0.index,idxDest,aItem);
          BigIndex::BigIndex(&local_a0,start);
          index.bigIndex = (uint64)aItem;
          index._0_8_ = local_a0.bigIndex;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar5,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)local_a0.index,index);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
        }
        else {
          (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (newArr,start & 0xffffffff,pvVar6,0);
        }
      }
      start = start + 1;
    } while (length != start);
  }
  bVar3 = IsNonES5Array(newObj);
  if (bVar3) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return newObj;
}

Assistant:

Var JavascriptArray::MapObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* newObj, JavascriptArray* newArr,
        bool isBuiltinArrayCtor, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);
        Var element = nullptr;
        Var mappedValue = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                    if (newArr && isBuiltinArrayCtor)
                    {
                        newArr->SetItem((uint32)k, mappedValue, PropertyOperation_None);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, BigIndex(k), mappedValue), scriptContext, BigIndex(k)));
                    }
            }
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }